

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd_test.cpp
# Opt level: O0

void __thiscall
Optional_RunDestructors_Test::~Optional_RunDestructors_Test(Optional_RunDestructors_Test *this)

{
  void *in_RDI;
  
  ~Optional_RunDestructors_Test((Optional_RunDestructors_Test *)0x67a008);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Optional, RunDestructors) {
    AliveCounter::nAlive = 0;

    pstd::optional<AliveCounter> opt;
    EXPECT_EQ(0, AliveCounter::nAlive);

    opt = AliveCounter();
    EXPECT_EQ(1, AliveCounter::nAlive);

    opt = AliveCounter();
    EXPECT_EQ(1, AliveCounter::nAlive);

    opt.reset();
    EXPECT_EQ(0, AliveCounter::nAlive);

    {
        pstd::optional<AliveCounter> opt2 = AliveCounter();
        EXPECT_EQ(1, AliveCounter::nAlive);
    }
    EXPECT_EQ(0, AliveCounter::nAlive);

    {
        AliveCounter ac2;
        EXPECT_EQ(1, AliveCounter::nAlive);

        opt.reset();
        EXPECT_EQ(1, AliveCounter::nAlive);

        opt = std::move(ac2);
        EXPECT_EQ(2, AliveCounter::nAlive);
    }
    EXPECT_EQ(1, AliveCounter::nAlive);

    opt.reset();
    EXPECT_EQ(0, AliveCounter::nAlive);

    {
        AliveCounter ac2;
        EXPECT_EQ(1, AliveCounter::nAlive);
        pstd::optional<AliveCounter> opt2(std::move(ac2));
        EXPECT_EQ(2, AliveCounter::nAlive);

        opt2.reset();
        EXPECT_EQ(1, AliveCounter::nAlive);
    }
    EXPECT_EQ(0, AliveCounter::nAlive);
}